

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O1

bool __thiscall
hwnet::TCPConnector::Connect(TCPConnector *this,ConnectCallback *connectFn,ErrorCallback *errorFn)

{
  Poller *this_00;
  int iVar1;
  uint uVar2;
  int *piVar3;
  socklen_t __len;
  bool bVar4;
  Ptr local_40;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_28;
  
  LOCK();
  bVar4 = (this->started)._M_base._M_i == false;
  if (bVar4) {
    (this->started)._M_base._M_i = true;
  }
  UNLOCK();
  if (!bVar4) {
    return false;
  }
  std::function<void_(int)>::operator=(&this->connectCallback_,connectFn);
  std::function<void_(int,_const_hwnet::Addr_&)>::operator=(&this->errorCallback_,errorFn);
  if (((this->connectCallback_).super__Function_base._M_manager != (_Manager_type)0x0) &&
     ((this->remoteAddr).addrType - 1U < 3)) {
    iVar1 = socket((this->remoteAddr).family,1,6);
    this->fd = iVar1;
    __len = 0;
    if (iVar1 < 0) {
      return false;
    }
    SetNoBlock(iVar1,true);
    SetCloseOnExec(this->fd);
    uVar2 = (this->remoteAddr).addrType - 1;
    if (uVar2 < 3) {
      __len = *(socklen_t *)(&DAT_0011ec98 + (ulong)uVar2 * 4);
    }
    iVar1 = connect(this->fd,(sockaddr *)&this->remoteAddr,__len);
    if ((iVar1 == 0) || (piVar3 = __errno_location(), *piVar3 == 0x73)) {
      iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
      if (iVar1 == 0) {
        this_00 = this->poller_;
        std::__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<hwnet::TCPConnector,void>
                  ((__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2> *)&local_30,
                   (__weak_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<hwnet::TCPConnector>);
        local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(local_30 + 8);
        if (local_30 == 0) {
          local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
        }
        local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Stack_28;
        local_30 = 0;
        p_Stack_28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Poller::Add(this_00,&local_40,4);
        if (local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (p_Stack_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_28);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
        return true;
      }
      std::__throw_system_error(iVar1);
    }
    close(this->fd);
    this->fd = -1;
  }
  return false;
}

Assistant:

bool TCPConnector::Connect(const ConnectCallback &connectFn,const ErrorCallback &errorFn) {

	bool expected = false;
	if(!this->started.compare_exchange_strong(expected,true)) {
		return false;
	}

	this->connectCallback_ = connectFn;
	this->errorCallback_ = errorFn;


	if(!this->connectCallback_) {
		return false;
	}

	if(!this->remoteAddr.IsVaild()) {
		return false;
	}

	this->fd = ::socket(this->remoteAddr.Family(),SOCK_STREAM,IPPROTO_TCP);
		
	if(this->fd < 0){
		return false;
	}

	SetNoBlock(this->fd,true);

	SetCloseOnExec(this->fd);

    int ret = ::connect(this->fd,this->remoteAddr.Address(),this->remoteAddr.AddrLen());

    if(ret == 0 || errno == EINPROGRESS) {
		std::lock_guard<std::mutex> guard(this->mtx);
    	this->poller_->Add(shared_from_this(),Poller::Write);
    	return true;
    } else {
    	::close(this->fd);
    	this->fd = -1;
    	return false;
    }
}